

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

LogicalConstant mp::internal::UncheckedCast<mp::LogicalConstant>(Expr e)

{
  Impl *in_RDI;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> *basic;
  LogicalConstant expr;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> *local_20;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> *local_18;
  ExprBase local_10;
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_8;
  
  local_10.impl_ = in_RDI;
  LogicalConstant::LogicalConstant((LogicalConstant *)0x433833);
  local_20 = &local_8;
  local_18 = local_20;
  Unused<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)48>*>(&local_20);
  return (LogicalConstant)local_10.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}